

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O0

uint32_t miniply::triangulate_polygon(uint32_t n,float *pos,uint32_t numVerts,int *indices,int *dst)

{
  allocator<unsigned_int> *this;
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  Vec3 rhs;
  Vec3 lhs;
  Vec3 lhs_00;
  reference pvVar4;
  reference pvVar5;
  float *pfVar6;
  undefined4 in_register_0000003c;
  miniply *this_00;
  allocator<miniply::Vec2> *this_01;
  float fVar7;
  float fVar8;
  Vec3 VVar9;
  Vec3 VVar10;
  Vec3 VVar11;
  uint32_t prevI;
  uint32_t nextI;
  float angle;
  uint32_t i_3;
  float bestAngle;
  uint32_t bestI;
  uint32_t j;
  uint32_t i_2;
  uint32_t first;
  undefined1 local_3d8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> prev;
  undefined1 local_3b8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> next;
  value_type local_320;
  Vec3 p;
  uint32_t i_1;
  allocator<miniply::Vec2> local_2a1;
  value_type local_2a0;
  undefined1 local_298 [8];
  vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> points2D;
  Vec3 faceV;
  Vec3 faceNormal;
  Vec3 faceU;
  Vec3 origin;
  Vec3 *vpos;
  int *piStack_30;
  uint32_t i;
  int *dst_local;
  int *indices_local;
  uint32_t numVerts_local;
  float *pos_local;
  uint32_t n_local;
  
  this_00 = (miniply *)CONCAT44(in_register_0000003c,n);
  if (n < 3) {
    pos_local._4_4_ = 0;
  }
  else if (n == 3) {
    *dst = *indices;
    dst[1] = indices[1];
    dst[2] = indices[2];
    pos_local._4_4_ = 1;
  }
  else if (n == 4) {
    *dst = *indices;
    dst[1] = indices[1];
    dst[2] = indices[3];
    dst[3] = indices[2];
    dst[4] = indices[3];
    dst[5] = indices[1];
    pos_local._4_4_ = 2;
  }
  else {
    for (vpos._4_4_ = 0; vpos._4_4_ < n; vpos._4_4_ = vpos._4_4_ + 1) {
      if ((indices[vpos._4_4_] < 0) || (numVerts <= (uint)indices[vpos._4_4_])) {
        return 0;
      }
    }
    fVar8 = pos[(long)*indices * 3 + 2];
    uVar3 = *(undefined8 *)(pos + (long)*indices * 3);
    lhs_00.z = pos[(long)indices[1] * 3 + 2];
    lhs_00.x = (pos + (long)indices[1] * 3)[0];
    lhs_00.y = (pos + (long)indices[1] * 3)[1];
    VVar10.z = fVar8;
    VVar10.x = (float)(int)uVar3;
    VVar10.y = (float)(int)((ulong)uVar3 >> 0x20);
    VVar9 = operator-(this_00,lhs_00,VVar10);
    VVar10 = normalize(VVar9);
    VVar11.z = pos[(long)indices[n - 1] * 3 + 2];
    VVar11.x = (pos + (long)indices[n - 1] * 3)[0];
    VVar11.y = (pos + (long)indices[n - 1] * 3)[1];
    VVar9.z = fVar8;
    VVar9.x = (float)(int)uVar3;
    VVar9.y = (float)(int)((ulong)uVar3 >> 0x20);
    VVar9 = operator-(this_00,VVar11,VVar9);
    VVar9 = normalize(VVar9);
    VVar9 = cross(VVar10,VVar9);
    VVar9 = normalize(VVar9);
    VVar9 = cross(VVar9,VVar10);
    VVar9 = normalize(VVar9);
    local_2a0.x = 0.0;
    local_2a0.y = 0.0;
    points2D.super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = VVar9._0_8_;
    std::allocator<miniply::Vec2>::allocator(&local_2a1);
    std::vector<miniply::Vec2,_std::allocator<miniply::Vec2>_>::vector
              ((vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> *)local_298,(ulong)n,
               &local_2a0,&local_2a1);
    this_01 = &local_2a1;
    std::allocator<miniply::Vec2>::~allocator(this_01);
    for (p.z = 1.4013e-45; (uint)p.z < n; p.z = (float)((int)p.z + 1)) {
      lhs.z = pos[(long)indices[(uint)p.z] * 3 + 2];
      lhs.x = (pos + (long)indices[(uint)p.z] * 3)[0];
      lhs.y = (pos + (long)indices[(uint)p.z] * 3)[1];
      rhs.z = fVar8;
      rhs.x = (float)(int)uVar3;
      rhs.y = (float)(int)((ulong)uVar3 >> 0x20);
      VVar11 = operator-((miniply *)this_01,lhs,rhs);
      fVar7 = dot(VVar11,VVar10);
      local_320.x = fVar7;
      next.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)VVar9._0_8_;
      fVar7 = dot(VVar11,VVar9);
      local_320.y = fVar7;
      this_01 = (allocator<miniply::Vec2> *)local_298;
      pvVar4 = std::vector<miniply::Vec2,_std::allocator<miniply::Vec2>_>::operator[]
                         ((vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> *)this_01,
                          (ulong)(uint)p.z);
      *pvVar4 = local_320;
    }
    prev.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    this = (allocator<unsigned_int> *)
           ((long)&prev.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<unsigned_int>::allocator(this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8,(ulong)n,
               (value_type_conflict1 *)
               ((long)&prev.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),this);
    std::allocator<unsigned_int>::~allocator
              ((allocator<unsigned_int> *)
               ((long)&prev.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3));
    first = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i_2 + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3d8,(ulong)n,&first,
               (allocator<unsigned_int> *)((long)&i_2 + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i_2 + 3));
    j = 0;
    bestAngle = (float)(n - 1);
    for (bestI = 0; piStack_30 = dst, pos_local._0_4_ = n, bestI < n; bestI = bestI + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8,
                          (ulong)(uint)bestAngle);
      *pvVar5 = bestI;
      pfVar6 = (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3d8,
                                   (ulong)bestI);
      *pfVar6 = bestAngle;
      bestAngle = (float)bestI;
    }
    for (; 3 < (uint32_t)pos_local; pos_local._0_4_ = (uint32_t)pos_local - 1) {
      i_3 = j;
      angle = angle_at_vert(j,(vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> *)local_298,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3d8,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8,(ulong)j)
      ;
      nextI = *pvVar5;
      while (nextI != j) {
        fVar8 = angle_at_vert(nextI,(vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> *)
                                    local_298,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3d8,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8);
        if (fVar8 < angle) {
          i_3 = nextI;
          angle = fVar8;
        }
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8,
                            (ulong)nextI);
        nextI = *pvVar5;
      }
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8,
                          (ulong)i_3);
      uVar1 = *pvVar5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3d8,
                          (ulong)i_3);
      uVar2 = *pvVar5;
      *piStack_30 = indices[i_3];
      piStack_30[1] = indices[uVar1];
      piStack_30[2] = indices[uVar2];
      piStack_30 = piStack_30 + 3;
      if (i_3 == j) {
        j = uVar1;
      }
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8,
                          (ulong)uVar2);
      *pvVar5 = uVar1;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3d8,
                          (ulong)uVar1);
      *pvVar5 = uVar2;
    }
    *piStack_30 = indices[j];
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8,(ulong)j);
    piStack_30[1] = indices[*pvVar5];
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3d8,(ulong)j);
    piStack_30[2] = indices[*pvVar5];
    pos_local._4_4_ = (uint32_t)pos_local - 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3d8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8);
    std::vector<miniply::Vec2,_std::allocator<miniply::Vec2>_>::~vector
              ((vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> *)local_298);
  }
  return pos_local._4_4_;
}

Assistant:

uint32_t triangulate_polygon(uint32_t n, const float pos[], uint32_t numVerts, const int indices[], int dst[])
  {
    if (n < 3) {
      return 0;
    }
    else if (n == 3) {
      dst[0] = indices[0];
      dst[1] = indices[1];
      dst[2] = indices[2];
      return 1;
    }
    else if (n == 4) {
      dst[0] = indices[0];
      dst[1] = indices[1];
      dst[2] = indices[3];

      dst[3] = indices[2];
      dst[4] = indices[3];
      dst[5] = indices[1];
      return 2;
    }

    // Check that all indices for this face are in the valid range before we
    // try to dereference them.
    for (uint32_t i = 0; i < n; i++) {
      if (indices[i] < 0 || uint32_t(indices[i]) >= numVerts) {
        return 0;
      }
    }

    const Vec3* vpos = reinterpret_cast<const Vec3*>(pos);

    // Calculate the geometric normal of the face
    Vec3 origin = vpos[indices[0]];
    Vec3 faceU = normalize(vpos[indices[1]] - origin);
    Vec3 faceNormal = normalize(cross(faceU, normalize(vpos[indices[n - 1]] - origin)));
    Vec3 faceV = normalize(cross(faceNormal, faceU));

    // Project the faces points onto the plane perpendicular to the normal.
    std::vector<Vec2> points2D(n, Vec2{0.0f, 0.0f});
    for (uint32_t i = 1; i < n; i++) {
      Vec3 p = vpos[indices[i]] - origin;
      points2D[i] = Vec2{dot(p, faceU), dot(p, faceV)};
    }

    std::vector<uint32_t> next(n, 0u);
    std::vector<uint32_t> prev(n, 0u);
    uint32_t first = 0;
    for (uint32_t i = 0, j = n - 1; i < n; i++) {
      next[j] = i;
      prev[i] = j;
      j = i;
    }

    // Do ear clipping.
    while (n > 3) {
      // Find the (remaining) vertex with the sharpest angle.
      uint32_t bestI = first;
      float bestAngle = angle_at_vert(first, points2D, prev, next);
      for (uint32_t i = next[first]; i != first; i = next[i]) {
        float angle = angle_at_vert(i, points2D, prev, next);
        if (angle < bestAngle) {
          bestI = i;
          bestAngle = angle;
        }
      }

      // Clip the triangle at bestI.
      uint32_t nextI = next[bestI];
      uint32_t prevI = prev[bestI];

      dst[0] = indices[bestI];
      dst[1] = indices[nextI];
      dst[2] = indices[prevI];
      dst += 3;

      if (bestI == first) {
        first = nextI;
      }
      next[prevI] = nextI;
      prev[nextI] = prevI;
      --n;
    }

    // Add the final triangle.
    dst[0] = indices[first];
    dst[1] = indices[next[first]];
    dst[2] = indices[prev[first]];

    return n - 2;
  }